

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int enc_worker_hook(void *arg1,void *unused)

{
  long lVar1;
  int iVar2;
  AV1_COMP *cpi_00;
  AV1_COMMON *cm_00;
  PC_TREE *pPVar3;
  long lVar4;
  long *in_RDI;
  TileDataEnc *this_tile;
  int tile_col;
  int tile_row;
  int t;
  int tile_rows;
  int tile_cols;
  AV1_COMMON *cm;
  aom_internal_error_info *error_info;
  MACROBLOCKD *xd;
  AV1_COMP *cpi;
  EncWorkerData *thread_data;
  undefined8 in_stack_ffffffffffffff98;
  BLOCK_SIZE bsize;
  int in_stack_ffffffffffffffb0;
  PARTITION_SEARCH_TYPE partition_search_type;
  int keep_best;
  int num_planes;
  ThreadData *td;
  int local_4;
  
  bsize = (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  lVar1 = *in_RDI;
  cpi_00 = (AV1_COMP *)(in_RDI[1] + 0x1a0);
  td = (ThreadData *)(in_RDI + 3);
  cm_00 = (AV1_COMMON *)(lVar1 + 0x3bf80);
  num_planes = *(int *)(lVar1 + 0x42020);
  keep_best = *(int *)(lVar1 + 0x42024);
  *(ThreadData **)(in_RDI[1] + 0x2b90) = td;
  iVar2 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x1e));
  if (iVar2 == 0) {
    (td->mb).plane[1].src.stride = 1;
    if (*(int *)(lVar1 + 0x60cb0) == 0) {
      *(undefined8 *)(in_RDI[1] + 0x26e50) = 0;
    }
    else {
      pPVar3 = av1_alloc_pc_tree_node(bsize);
      *(PC_TREE **)(in_RDI[1] + 0x26e50) = pPVar3;
      if (*(long *)(in_RDI[1] + 0x26e50) == 0) {
        aom_internal_error(*(aom_internal_error_info **)
                            (cpi_00->enc_quant_dequant_params).quants.y_zbin[0x9e],
                           AOM_CODEC_MEM_ERROR,"Failed to allocate PC_TREE");
      }
    }
    for (iVar2 = (int)in_RDI[0x39];
        partition_search_type = (PARTITION_SEARCH_TYPE)((uint)in_stack_ffffffffffffffb0 >> 0x18),
        iVar2 < keep_best * num_planes; iVar2 = *(int *)(lVar1 + 0x9ae48) + iVar2) {
      in_stack_ffffffffffffffb0 = iVar2 / num_planes;
      lVar4 = *(long *)(lVar1 + 0x71318) +
              (long)(in_stack_ffffffffffffffb0 * (cm_00->tiles).cols + iVar2 % num_planes) * 0x5d10;
      *(long *)(in_RDI[1] + 0x2b38) = lVar4 + 0x20;
      *(long *)(in_RDI[1] + 0x4188) = lVar4 + 0x20;
      av1_encode_tile(cpi_00,td,(int)((ulong)cm_00 >> 0x20),(int)cm_00);
    }
    av1_num_planes(cm_00);
    av1_free_pc_tree_recursive((PC_TREE *)cm_00,num_planes,keep_best,iVar2,partition_search_type);
    *(undefined8 *)(in_RDI[1] + 0x26e50) = 0;
    (td->mb).plane[1].src.stride = 0;
    local_4 = 1;
  }
  else {
    (td->mb).plane[1].src.stride = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int enc_worker_hook(void *arg1, void *unused) {
  EncWorkerData *const thread_data = (EncWorkerData *)arg1;
  AV1_COMP *const cpi = thread_data->cpi;
  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  const AV1_COMMON *const cm = &cpi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int t;

  (void)unused;

  xd->error_info = error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
    return 0;
  }
  error_info->setjmp = 1;

  // Preallocate the pc_tree for realtime coding to reduce the cost of memory
  // allocation.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode) {
    thread_data->td->pc_root = av1_alloc_pc_tree_node(cm->seq_params->sb_size);
    if (!thread_data->td->pc_root)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
  } else {
    thread_data->td->pc_root = NULL;
  }

  for (t = thread_data->start; t < tile_rows * tile_cols;
       t += cpi->mt_info.num_workers) {
    int tile_row = t / tile_cols;
    int tile_col = t % tile_cols;

    TileDataEnc *const this_tile =
        &cpi->tile_data[tile_row * cm->tiles.cols + tile_col];
    thread_data->td->mb.e_mbd.tile_ctx = &this_tile->tctx;
    thread_data->td->mb.tile_pb_ctx = &this_tile->tctx;
    av1_encode_tile(cpi, thread_data->td, tile_row, tile_col);
  }

  av1_free_pc_tree_recursive(thread_data->td->pc_root, av1_num_planes(cm), 0, 0,
                             cpi->sf.part_sf.partition_search_type);
  thread_data->td->pc_root = NULL;
  error_info->setjmp = 0;
  return 1;
}